

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

CommandLineFlagInfo *
google::GetCommandLineFlagInfoOrDie(CommandLineFlagInfo *__return_storage_ptr__,char *name)

{
  bool bVar1;
  CommandLineFlagInfo *pCVar2;
  
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->type)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->type).field_2
  ;
  (__return_storage_ptr__->type)._M_string_length = 0;
  (__return_storage_ptr__->type).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->description).field_2;
  (__return_storage_ptr__->description)._M_string_length = 0;
  (__return_storage_ptr__->description).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->current_value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->current_value).field_2;
  (__return_storage_ptr__->current_value)._M_string_length = 0;
  (__return_storage_ptr__->current_value).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->default_value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->default_value).field_2;
  (__return_storage_ptr__->default_value)._M_string_length = 0;
  (__return_storage_ptr__->default_value).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->filename).field_2;
  (__return_storage_ptr__->filename)._M_string_length = 0;
  (__return_storage_ptr__->filename).field_2._M_local_buf[0] = '\0';
  bVar1 = GetCommandLineFlagInfo(name,__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  fprintf(_stderr,"FATAL ERROR: flag name \'%s\' doesn\'t exist\n",name);
  pCVar2 = (CommandLineFlagInfo *)(*(code *)gflags_exitfunc)(1);
  return pCVar2;
}

Assistant:

CommandLineFlagInfo GetCommandLineFlagInfoOrDie(const char* name) {
  CommandLineFlagInfo info;
  if (!GetCommandLineFlagInfo(name, &info)) {
    fprintf(stderr, "FATAL ERROR: flag name '%s' doesn't exist\n", name);
    gflags_exitfunc(1);    // almost certainly gflags_exitfunc()
  }
  return info;
}